

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib506.c
# Opt level: O0

void my_lock(CURL *handle,curl_lock_data data,curl_lock_access laccess,void *useptr)

{
  int local_34;
  int locknum;
  userdata *user;
  char *what;
  void *useptr_local;
  curl_lock_access laccess_local;
  curl_lock_data data_local;
  CURL *handle_local;
  
  if (data == CURL_LOCK_DATA_SHARE) {
    user = (userdata *)anon_var_dwarf_33f;
    local_34 = 0;
  }
  else if (data == CURL_LOCK_DATA_COOKIE) {
    user = (userdata *)anon_var_dwarf_353;
    local_34 = 2;
  }
  else {
    if (data != CURL_LOCK_DATA_DNS) {
      curl_mfprintf(_stderr,"lock: no such data: %d\n",data);
      return;
    }
    user = (userdata *)anon_var_dwarf_349;
    local_34 = 1;
  }
  if (locks[local_34] == 0) {
    locks[local_34] = locks[local_34] + 1;
    curl_mprintf("lock:   %-6s [%s]: %d\n",user,*useptr,*(undefined4 *)((long)useptr + 8));
    *(int *)((long)useptr + 8) = *(int *)((long)useptr + 8) + 1;
  }
  else {
    curl_mprintf("lock: double locked %s\n",user);
  }
  return;
}

Assistant:

static void my_lock(CURL *handle, curl_lock_data data,
                    curl_lock_access laccess, void *useptr)
{
  const char *what;
  struct userdata *user = (struct userdata *)useptr;
  int locknum;

  (void)handle;
  (void)laccess;

  switch(data) {
    case CURL_LOCK_DATA_SHARE:
      what = "share";
      locknum = 0;
      break;
    case CURL_LOCK_DATA_DNS:
      what = "dns";
      locknum = 1;
      break;
    case CURL_LOCK_DATA_COOKIE:
      what = "cookie";
      locknum = 2;
      break;
    default:
      fprintf(stderr, "lock: no such data: %d\n", (int)data);
      return;
  }

  /* detect locking of locked locks */
  if(locks[locknum]) {
    printf("lock: double locked %s\n", what);
    return;
  }
  locks[locknum]++;

  printf("lock:   %-6s [%s]: %d\n", what, user->text, user->counter);
  user->counter++;
}